

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprogrammetocsv.cpp
# Opt level: O1

void fmprogrammetocsv::doit(bool skipheader)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  fm_programme q;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("from_agg_id,level_id,to_agg_id");
  }
  sVar1 = fread(&local_24,0xc,1,_stdin);
  if (sVar1 != 0) {
    do {
      printf("%d, %d, %d\n",(ulong)local_24,(ulong)local_20,(ulong)local_1c);
      sVar1 = fread(&local_24,0xc,1,_stdin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void doit(bool skipheader) {
        if (skipheader == false)
            printf("from_agg_id,level_id,to_agg_id\n");

        fm_programme q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            printf("%d, %d, %d\n", q.from_agg_id, q.level_id, q.to_agg_id);
            i = fread(&q, sizeof(q), 1, stdin);
        }
    }